

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbAbc.c
# Opt level: O2

Acb_Ntk_t * Acb_NtkFromAbc2(Abc_Ntk_t *p)

{
  uint nCos;
  int iVar1;
  int iVar2;
  Acb_Man_t *p_00;
  Acb_Ntk_t *p_01;
  Abc_Obj_t *pAVar3;
  word x;
  Abc_Nam_t *in_RCX;
  ulong uVar4;
  Abc_Nam_t *in_RDX;
  Abc_Nam_t *in_R8;
  Hash_IntMan_t *in_R9;
  long lVar5;
  
  p_00 = Acb_ManAlloc(p->pSpec,0,in_RDX,in_RCX,in_R8,in_R9);
  iVar1 = Abc_NamStrFindOrAdd(p_00->pStrs,p->pName,(int *)0x0);
  nCos = p->vCos->nSize;
  uVar4 = (ulong)nCos;
  p_01 = Acb_NtkAlloc(p_00,iVar1,p->vCis->nSize,nCos,p->nObjs);
  if ((p->ntkFunc == ABC_FUNC_SOP) && (p->ntkType == ABC_NTK_LOGIC)) {
    p_01->nFaninMax = 6;
    for (iVar1 = 0; iVar1 < p->vCis->nSize; iVar1 = iVar1 + 1) {
      pAVar3 = Abc_NtkCi(p,iVar1);
      iVar2 = Acb_ObjAlloc(p_01,ABC_OPER_CI,0,(int)uVar4);
      (pAVar3->field_6).iTemp = iVar2;
    }
    for (iVar1 = 0; iVar1 < p->vObjs->nSize; iVar1 = iVar1 + 1) {
      pAVar3 = Abc_NtkObj(p,iVar1);
      if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
        iVar2 = Acb_ObjAlloc(p_01,ABC_OPER_LUT,(pAVar3->vFanins).nSize,(int)uVar4);
        (pAVar3->field_6).iTemp = iVar2;
      }
    }
    for (iVar1 = 0; iVar1 < p->vCos->nSize; iVar1 = iVar1 + 1) {
      pAVar3 = Abc_NtkCo(p,iVar1);
      iVar2 = Acb_ObjAlloc(p_01,ABC_OPER_CO,1,(int)uVar4);
      (pAVar3->field_6).iTemp = iVar2;
    }
    for (iVar1 = 0; iVar1 < p->vObjs->nSize; iVar1 = iVar1 + 1) {
      pAVar3 = Abc_NtkObj(p,iVar1);
      if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
        for (lVar5 = 0; lVar5 < (pAVar3->vFanins).nSize; lVar5 = lVar5 + 1) {
          Acb_ObjAddFanin(p_01,(pAVar3->field_6).iTemp,
                          *(int *)((long)pAVar3->pNtk->vObjs->pArray
                                         [(pAVar3->vFanins).pArray[lVar5]] + 0x40));
        }
      }
    }
    for (iVar1 = 0; iVar1 < p->vCos->nSize; iVar1 = iVar1 + 1) {
      pAVar3 = Abc_NtkCo(p,iVar1);
      Acb_ObjAddFanin(p_01,(pAVar3->field_6).iTemp,
                      *(int *)((long)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray] + 0x40))
      ;
    }
    Acb_NtkCleanObjTruths(p_01);
    for (iVar1 = 0; iVar1 < p->vObjs->nSize; iVar1 = iVar1 + 1) {
      pAVar3 = Abc_NtkObj(p,iVar1);
      if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
        iVar2 = (pAVar3->field_6).iTemp;
        x = Abc_SopToTruth((char *)(pAVar3->field_5).pData,(pAVar3->vFanins).nSize);
        Acb_ObjSetTruth(p_01,iVar2,x);
      }
    }
    p_01->nRegs = p->nObjCounts[8];
    Acb_NtkAdd(p_00,p_01);
    return p_01;
  }
  __assert_fail("Abc_NtkIsSopLogic(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbAbc.c"
                ,0x35,"Acb_Ntk_t *Acb_NtkFromAbc2(Abc_Ntk_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Acb_Ntk_t * Acb_NtkFromAbc2( Abc_Ntk_t * p )
{
    Acb_Man_t * pMan = Acb_ManAlloc( Abc_NtkSpec(p), 1, NULL, NULL, NULL, NULL );
    int i, k, NameId = Abc_NamStrFindOrAdd( pMan->pStrs, Abc_NtkName(p), NULL );
    Acb_Ntk_t * pNtk = Acb_NtkAlloc( pMan, NameId, Abc_NtkCiNum(p), Abc_NtkCoNum(p), Abc_NtkObjNum(p) );
    Abc_Obj_t * pObj, * pFanin;
    assert( Abc_NtkIsSopLogic(p) );
    pNtk->nFaninMax = 6;
    Abc_NtkForEachCi( p, pObj, i )
        pObj->iTemp = Acb_ObjAlloc( pNtk, ABC_OPER_CI, 0, 0 );
    Abc_NtkForEachNode( p, pObj, i )
        pObj->iTemp = Acb_ObjAlloc( pNtk, ABC_OPER_LUT, Abc_ObjFaninNum(pObj), 0 );
    Abc_NtkForEachCo( p, pObj, i )
        pObj->iTemp = Acb_ObjAlloc( pNtk, ABC_OPER_CO, 1, 0 );
    Abc_NtkForEachNode( p, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Acb_ObjAddFanin( pNtk, pObj->iTemp, pFanin->iTemp );
    Abc_NtkForEachCo( p, pObj, i )
        Acb_ObjAddFanin( pNtk, pObj->iTemp, Abc_ObjFanin(pObj, 0)->iTemp );
    Acb_NtkCleanObjTruths( pNtk );
    Abc_NtkForEachNode( p, pObj, i )
        Acb_ObjSetTruth( pNtk, pObj->iTemp, Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj)) );
    Acb_NtkSetRegNum( pNtk, Abc_NtkLatchNum(p) );
    Acb_NtkAdd( pMan, pNtk );
    return pNtk;
}